

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O0

void write_var(Context *ctx,Var obj,PropertyId id,Var *var)

{
  bool bVar1;
  char *pcVar2;
  string *src;
  int __c;
  Var *var_local;
  PropertyId id_local;
  Var obj_local;
  Context *ctx_local;
  
  pcVar2 = (char *)obj;
  bVar1 = wabt::Var::is_index(var);
  if (bVar1) {
    pcVar2 = wabt::Var::index(var,pcVar2,__c);
    write_int64(ctx,obj,id,(ulong)pcVar2 & 0xffffffff);
  }
  else {
    bVar1 = wabt::Var::is_name(var);
    if (!bVar1) {
      __assert_fail("var->is_name()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                    ,0x8b,"void write_var(Context *, Js::Var, PropertyId, const Var *)");
    }
    src = wabt::Var::name_abi_cxx11_(var);
    write_string(ctx,obj,id,src);
  }
  return;
}

Assistant:

void write_var(Context* ctx, Js::Var obj, PropertyId id, const Var* var)
{
    if (var->is_index())
    {
        write_int64(ctx, obj, id, var->index());
    }
    else
    {
        assert(var->is_name());
        write_string(ctx, obj, id, var->name());
    }
}